

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O2

Parser * Omega_h::accept_parser(Parser *__return_storage_ptr__,ParserInProgress *pip)

{
  GrammarPtr *pGVar1;
  StateInProgress *pSVar2;
  pointer pAVar3;
  bool bVar4;
  int iVar5;
  pointer puVar6;
  const_reference pvVar7;
  _Base_ptr p_Var8;
  pointer puVar9;
  int s_i;
  int iVar10;
  pointer pAVar11;
  __shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pGVar1 = &pip->grammar;
  std::__shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &pGVar1->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>);
  Parser::Parser(__return_storage_ptr__,(GrammarPtr *)&local_40,
                 (int)((ulong)((long)(pip->states).
                                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pip->states).
                                    super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  iVar10 = 0;
  while( true ) {
    puVar9 = (pip->states).
             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pip->states).
             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)puVar6 - (long)puVar9) >> 3) <= iVar10) break;
    add_state(__return_storage_ptr__);
    iVar10 = iVar10 + 1;
  }
  iVar10 = 0;
  do {
    if ((int)((ulong)((long)puVar6 - (long)puVar9) >> 3) <= iVar10) {
      return __return_storage_ptr__;
    }
    pvVar7 = at<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                       (&pip->states,iVar10);
    pSVar2 = (pvVar7->_M_t).
             super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
             ._M_t.
             super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
             .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl;
    pAVar3 = *(pointer *)
              ((long)&(pSVar2->actions).
                      super__Vector_base<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>
              + 8);
    for (pAVar11 = *(pointer *)
                    &(pSVar2->actions).
                     super__Vector_base<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>
                     ._M_impl; pAVar11 != pAVar3; pAVar11 = pAVar11 + 1) {
      if ((pAVar11->action).kind == ACTION_SHIFT) {
        bVar4 = is_nonterminal((pGVar1->
                               super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr,(*(_Base_ptr *)((long)&(pAVar11->context)._M_t + 0x18))[1].
                                        _M_color);
        if (!bVar4) goto LAB_00246575;
        iVar5 = as_nonterminal((pGVar1->
                               super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr,(*(_Base_ptr *)((long)&(pAVar11->context)._M_t + 0x18))[1].
                                        _M_color);
        add_nonterminal_action
                  (__return_storage_ptr__,iVar10,iVar5,(pAVar11->action).field_1.production);
      }
      else {
LAB_00246575:
        for (p_Var8 = *(_Base_ptr *)((long)&(pAVar11->context)._M_t + 0x18);
            p_Var8 != (_Rb_tree_node_base *)((long)&(pAVar11->context)._M_t + 8U);
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          iVar5 = p_Var8[1]._M_color;
          bVar4 = is_terminal((pGVar1->
                              super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,iVar5);
          if (!bVar4) {
            fail("assertion %s failed at %s +%d\n","is_terminal(*grammar, terminal)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                 ,0x465);
          }
          add_terminal_action(__return_storage_ptr__,iVar10,iVar5,pAVar11->action);
        }
      }
    }
    iVar10 = iVar10 + 1;
    puVar9 = (pip->states).
             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pip->states).
             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

Parser accept_parser(ParserInProgress const& pip) {
  auto& sips = pip.states;
  auto& grammar = pip.grammar;
  auto out = Parser(grammar, size(sips));
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    add_state(out);
  }
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    auto& sip = *at(sips, s_i);
    for (auto& action : sip.actions) {
      if (action.action.kind == ACTION_SHIFT &&
          is_nonterminal(*grammar, *(action.context.begin()))) {
        auto nt = as_nonterminal(*grammar, *(action.context.begin()));
        add_nonterminal_action(out, s_i, nt, action.action.next_state);
      } else {
        for (auto terminal : action.context) {
          OMEGA_H_CHECK(is_terminal(*grammar, terminal));
          add_terminal_action(out, s_i, terminal, action.action);
        }
      }
    }
  }
  return out;
}